

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O2

void __thiscall LowererMD::GenerateFastInlineBuiltInMathAbs(LowererMD *this,Instr *inlineInstr)

{
  IRType IVar1;
  code *pcVar2;
  bool bVar3;
  RegNum RVar4;
  Opnd *src1Opnd;
  RegOpnd *regOpnd;
  undefined4 *puVar5;
  LabelInstr *instr;
  Instr *pIVar6;
  RegOpnd *regOpnd_00;
  RegOpnd *dstOpnd;
  Func *pFVar7;
  OpCode OVar8;
  
  src1Opnd = IR::Opnd::Copy(inlineInstr->m_src1,this->m_func);
  regOpnd = (RegOpnd *)IR::Instr::UnlinkDst(inlineInstr);
  if (src1Opnd == (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x2121,"(src)","src");
    if (!bVar3) goto LAB_005e28f9;
    *puVar5 = 0;
  }
  instr = IR::LabelInstr::New(Label,this->m_func,false);
  pIVar6 = Lowerer::LowerBailOnIntMin
                     (this->m_lowerer,inlineInstr,(BranchInstr *)0x0,(LabelInstr *)0x0);
  IR::Instr::InsertAfter(pIVar6,&instr->super_Instr);
  IVar1 = src1Opnd->m_type;
  if (IVar1 == TyFloat64) {
    bVar3 = IR::Opnd::IsRegOpnd((Opnd *)regOpnd);
    pFVar7 = this->m_func;
    if (bVar3) {
      OVar8 = MOVSD;
LAB_005e27ad:
      pIVar6 = IR::Instr::New(OVar8,(Opnd *)regOpnd,src1Opnd,pFVar7);
      IR::Instr::InsertBefore(&instr->super_Instr,pIVar6);
      GenerateFloatAbs(this,regOpnd,&instr->super_Instr);
      return;
    }
    regOpnd_00 = IR::RegOpnd::New((StackSym *)0x0,TyFloat64,pFVar7);
    regOpnd_00->field_0x18 = regOpnd_00->field_0x18 | 2;
    pIVar6 = IR::Instr::New(MOVSD,&regOpnd_00->super_Opnd,src1Opnd,this->m_func);
    IR::Instr::InsertBefore(&instr->super_Instr,pIVar6);
    GenerateFloatAbs(this,regOpnd_00,&instr->super_Instr);
    pFVar7 = this->m_func;
    OVar8 = MOVSD;
  }
  else if (IVar1 == TyFloat32) {
    bVar3 = IR::Opnd::IsRegOpnd((Opnd *)regOpnd);
    pFVar7 = this->m_func;
    if (bVar3) {
      OVar8 = MOVSS;
      goto LAB_005e27ad;
    }
    regOpnd_00 = IR::RegOpnd::New((StackSym *)0x0,TyFloat32,pFVar7);
    regOpnd_00->field_0x18 = regOpnd_00->field_0x18 | 2;
    pIVar6 = IR::Instr::New(MOVSS,&regOpnd_00->super_Opnd,src1Opnd,this->m_func);
    IR::Instr::InsertBefore(&instr->super_Instr,pIVar6);
    GenerateFloatAbs(this,regOpnd_00,&instr->super_Instr);
    pFVar7 = this->m_func;
    OVar8 = MOVSS;
  }
  else {
    if (IVar1 != TyInt32) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                         ,0x2185,"(0)",
                         "GenerateFastInlineBuiltInMathAbs: unexpected type of the src!");
      if (bVar3) {
        *puVar5 = 0;
        return;
      }
LAB_005e28f9:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    regOpnd_00 = IR::RegOpnd::New(TyInt32,this->m_func);
    RVar4 = LowererMDArch::GetRegIMulDestLower();
    regOpnd_00->m_reg = RVar4;
    pIVar6 = IR::Instr::New(MOV,&regOpnd_00->super_Opnd,src1Opnd,this->m_func);
    IR::Instr::InsertBefore(&instr->super_Instr,pIVar6);
    dstOpnd = IR::RegOpnd::New(TyInt32,this->m_func);
    RVar4 = LowererMDArch::GetRegIMulHighDestLower();
    dstOpnd->m_reg = RVar4;
    pIVar6 = IR::Instr::New(CDQ,&dstOpnd->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(&instr->super_Instr,pIVar6);
    pIVar6 = IR::Instr::New(XOR,&regOpnd_00->super_Opnd,&regOpnd_00->super_Opnd,&dstOpnd->super_Opnd
                            ,this->m_func);
    IR::Instr::InsertBefore(&instr->super_Instr,pIVar6);
    pIVar6 = IR::Instr::New(SUB,&regOpnd_00->super_Opnd,&regOpnd_00->super_Opnd,&dstOpnd->super_Opnd
                            ,this->m_func);
    IR::Instr::InsertBefore(&instr->super_Instr,pIVar6);
    pFVar7 = this->m_func;
    OVar8 = MOV;
  }
  pIVar6 = IR::Instr::New(OVar8,(Opnd *)regOpnd,&regOpnd_00->super_Opnd,pFVar7);
  IR::Instr::InsertBefore(&instr->super_Instr,pIVar6);
  return;
}

Assistant:

void LowererMD::GenerateFastInlineBuiltInMathAbs(IR::Instr* inlineInstr)
{
    IR::Opnd* src = inlineInstr->GetSrc1()->Copy(this->m_func);
    IR::Opnd* dst = inlineInstr->UnlinkDst();
    Assert(src);
    IR::Instr* tmpInstr;

    IR::Instr* nextInstr = IR::LabelInstr::New(Js::OpCode::Label, m_func);
    IR::Instr* continueInstr = m_lowerer->LowerBailOnIntMin(inlineInstr);
    continueInstr->InsertAfter(nextInstr);

    IRType srcType = src->GetType();
    if (srcType == IRType::TyInt32)
    {
        // Note: if execution gets so far, we always get (untagged) int32 here.
        // Since -x = ~x + 1, abs(x) = x, abs(-x) = -x, sign-extend(x) = 0, sign_extend(-x) = -1, where 0 <= x.
        // Then: abs(x) = sign-extend(x) XOR x - sign-extend(x)

        // Expected input (otherwise bailout):
        // - src1 is (untagged) int, not equal to int_min (abs(int_min) would produce overflow, as there's no corresponding positive int).

        //      MOV EAX, src
        IR::RegOpnd *regEAX = IR::RegOpnd::New(TyInt32, this->m_func);
        regEAX->SetReg(LowererMDArch::GetRegIMulDestLower());

        tmpInstr = IR::Instr::New(Js::OpCode::MOV, regEAX, src, this->m_func);
        nextInstr->InsertBefore(tmpInstr);

        IR::RegOpnd *regEDX = IR::RegOpnd::New(TyInt32, this->m_func);
        regEDX->SetReg(LowererMDArch::GetRegIMulHighDestLower());

        //      CDQ (sign-extend EAX into EDX, producing 64bit EDX:EAX value)
        // Note: put EDX on dst to give of def to the EDX lifetime
        tmpInstr = IR::Instr::New(Js::OpCode::CDQ, regEDX, this->m_func);
        nextInstr->InsertBefore(tmpInstr);

        //      XOR EAX, EDX
        tmpInstr = IR::Instr::New(Js::OpCode::XOR, regEAX, regEAX, regEDX, this->m_func);
        nextInstr->InsertBefore(tmpInstr);

        //      SUB EAX, EDX
        tmpInstr = IR::Instr::New(Js::OpCode::SUB, regEAX, regEAX, regEDX, this->m_func);
        nextInstr->InsertBefore(tmpInstr);

        //      MOV dst, EAX
        tmpInstr = IR::Instr::New(Js::OpCode::MOV, dst, regEAX, this->m_func);
        nextInstr->InsertBefore(tmpInstr);
    }
    else if (srcType == IRType::TyFloat64)
    {
        if (!dst->IsRegOpnd())
        {
            // MOVSD tempRegOpnd, src
            IR::RegOpnd* tempRegOpnd = IR::RegOpnd::New(nullptr, TyMachDouble, this->m_func);
            tempRegOpnd->m_isCallArg = true; // This is to make sure that lifetime of opnd is virtually extended until next CALL instr.
            tmpInstr = IR::Instr::New(Js::OpCode::MOVSD, tempRegOpnd, src, this->m_func);
            nextInstr->InsertBefore(tmpInstr);

            // This saves the result in the same register.
            this->GenerateFloatAbs(static_cast<IR::RegOpnd*>(tempRegOpnd), nextInstr);

            // MOVSD dst, tempRegOpnd
            tmpInstr = IR::Instr::New(Js::OpCode::MOVSD, dst, tempRegOpnd, this->m_func);
            nextInstr->InsertBefore(tmpInstr);
        }
        else
        {
            // MOVSD dst, src
            tmpInstr = IR::Instr::New(Js::OpCode::MOVSD, dst, src, this->m_func);
            nextInstr->InsertBefore(tmpInstr);

            // This saves the result in the same register.
            this->GenerateFloatAbs(static_cast<IR::RegOpnd*>(dst), nextInstr);
        }
    }
    else if (srcType == IRType::TyFloat32)
    {
        if (!dst->IsRegOpnd())
        {
            // MOVSS tempRegOpnd, src
            IR::RegOpnd* tempRegOpnd = IR::RegOpnd::New(nullptr, TyFloat32, this->m_func);
            tempRegOpnd->m_isCallArg = true; // This is to make sure that lifetime of opnd is virtually extended until next CALL instr.
            tmpInstr = IR::Instr::New(Js::OpCode::MOVSS, tempRegOpnd, src, this->m_func);
            nextInstr->InsertBefore(tmpInstr);

            // This saves the result in the same register.
            this->GenerateFloatAbs(static_cast<IR::RegOpnd*>(tempRegOpnd), nextInstr);

            // MOVSS dst, tempRegOpnd
            tmpInstr = IR::Instr::New(Js::OpCode::MOVSS, dst, tempRegOpnd, this->m_func);
            nextInstr->InsertBefore(tmpInstr);
        }
        else
        {
            // MOVSS dst, src
            tmpInstr = IR::Instr::New(Js::OpCode::MOVSS, dst, src, this->m_func);
            nextInstr->InsertBefore(tmpInstr);

            // This saves the result in the same register.
            this->GenerateFloatAbs(static_cast<IR::RegOpnd*>(dst), nextInstr);
        }
    }
    else
    {
        AssertMsg(FALSE, "GenerateFastInlineBuiltInMathAbs: unexpected type of the src!");
    }
}